

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O2

void smooth_h_predictor(uint8_t *dst,ptrdiff_t stride,int bw,int bh,uint8_t *above,uint8_t *left)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  int c;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  byte local_24 [3];
  uint8_t local_21;
  uint8_t weights [2];
  uint8_t pixels [2];
  
  local_21 = above[(long)bw + -1];
  uVar5 = 0;
  uVar1 = (ulong)(uint)bw;
  if (bw < 1) {
    uVar1 = uVar5;
  }
  uVar2 = (ulong)(uint)bh;
  if (bh < 1) {
    uVar2 = uVar5;
  }
  for (; uVar5 != uVar2; uVar5 = uVar5 + 1) {
    for (uVar4 = 0; uVar4 != uVar1; uVar4 = uVar4 + 1) {
      local_24[2] = left[uVar5];
      local_24[0] = (&DAT_0046dea4)[uVar4 + (uint)bw];
      local_24[1] = -(&DAT_0046dea4)[uVar4 + (uint)bw];
      iVar3 = 0;
      for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
        iVar3 = iVar3 + (uint)local_24[lVar6 + 2] * (uint)local_24[lVar6];
      }
      dst[uVar4] = (uint8_t)((uint)(iVar3 + 0x80) >> 8);
    }
    dst = dst + stride;
  }
  return;
}

Assistant:

static inline void smooth_h_predictor(uint8_t *dst, ptrdiff_t stride, int bw,
                                      int bh, const uint8_t *above,
                                      const uint8_t *left) {
  const uint8_t right_pred = above[bw - 1];  // estimated by top-right pixel
  const uint8_t *const sm_weights = smooth_weights + bw - 4;
  // scale = 2^SMOOTH_WEIGHT_LOG2_SCALE
  const int log2_scale = SMOOTH_WEIGHT_LOG2_SCALE;
  const uint16_t scale = (1 << SMOOTH_WEIGHT_LOG2_SCALE);
  sm_weights_sanity_checks(sm_weights, sm_weights, scale,
                           log2_scale + sizeof(*dst));

  int r;
  for (r = 0; r < bh; r++) {
    int c;
    for (c = 0; c < bw; ++c) {
      const uint8_t pixels[] = { left[r], right_pred };
      const uint8_t weights[] = { sm_weights[c], scale - sm_weights[c] };
      uint32_t this_pred = 0;
      assert(scale >= sm_weights[c]);
      int i;
      for (i = 0; i < 2; ++i) {
        this_pred += weights[i] * pixels[i];
      }
      dst[c] = divide_round(this_pred, log2_scale);
    }
    dst += stride;
  }
}